

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O2

void * hashmap_delete_with_hash(hashmap *map,void *key,uint64_t hash)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *__dest;
  ulong *__src;
  
  map->oom = false;
  uVar3 = map->mask;
  uVar5 = uVar3 & hash & 0xffffffffffff;
  do {
    lVar4 = map->bucketsz * uVar5;
    uVar1 = *(ulong *)((long)map->buckets + lVar4);
    if (uVar1 < 0x1000000000000) {
      return (void *)0x0;
    }
    if ((uVar1 & 0xffffffffffff) == (hash & 0xffffffffffff)) {
      __dest = (ulong *)((long)map->buckets + lVar4);
      if ((map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0) ||
         (iVar2 = (*map->compare)(key,__dest + 1,map->udata), iVar2 == 0)) {
        memcpy(map->spare,__dest + 1,map->elsize);
        *__dest = *__dest & 0xffffffffffff;
        while( true ) {
          uVar5 = uVar5 + 1 & map->mask;
          lVar4 = map->bucketsz * uVar5;
          if (*(ulong *)((long)map->buckets + lVar4) >> 0x31 == 0) break;
          __src = (ulong *)((long)map->buckets + lVar4);
          memcpy(__dest,__src,map->bucketsz);
          *__dest = *__dest & 0xffffffffffff | (*__dest & 0xffff000000000000) - 0x1000000000000;
          __dest = __src;
        }
        *__dest = *__dest & 0xffffffffffff;
        uVar3 = map->count - 1;
        map->count = uVar3;
        if ((map->cap < map->nbuckets) && (uVar3 <= map->shrinkat)) {
          resize(map,map->nbuckets >> 1);
        }
        return map->spare;
      }
      uVar3 = map->mask;
    }
    uVar5 = uVar5 + 1 & uVar3;
  } while( true );
}

Assistant:

const void *hashmap_delete_with_hash(struct hashmap *map, const void *key,
    uint64_t hash)
{
    hash = clip_hash(hash);
    map->oom = false;
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) {
            return NULL;
        }
        void *bitem = bucket_item(bucket);
        if (bucket->hash == hash && (!map->compare ||
            map->compare(key, bitem, map->udata) == 0))
        {
            memcpy(map->spare, bitem, map->elsize);
            bucket->dib = 0;
            while(1) {
                struct bucket *prev = bucket;
                i = (i + 1) & map->mask;
                bucket = bucket_at(map, i);
                if (bucket->dib <= 1) {
                    prev->dib = 0;
                    break;
                }
                memcpy(prev, bucket, map->bucketsz);
                prev->dib--;
            }
            map->count--;
            if (map->nbuckets > map->cap && map->count <= map->shrinkat) {
                // Ignore the return value. It's ok for the resize operation to
                // fail to allocate enough memory because a shrink operation
                // does not change the integrity of the data.
                resize(map, map->nbuckets/2);
            }
            return map->spare;
        }
        i = (i + 1) & map->mask;
    }
}